

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unordered_map_constructor_test.h
# Opt level: O0

void __thiscall
phmap::priv::gtest_suite_ConstructorTest_::
InitializerListBucketHashEqualAlloc<phmap::parallel_flat_hash_map<phmap::priv::NonStandardLayout,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>,_4UL,_phmap::NullMutex>_>
::TestBody(InitializerListBucketHashEqualAlloc<phmap::parallel_flat_hash_map<phmap::priv::NonStandardLayout,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>,_4UL,_phmap::NullMutex>_>
           *this)

{
  initializer_list<std::pair<const_phmap::priv::NonStandardLayout,_int>_> iVar1;
  bool bVar2;
  char *pcVar3;
  Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_> *lhs;
  parallel_flat_hash_map<phmap::priv::NonStandardLayout,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>,_4UL,_phmap::NullMutex>
  *m_00;
  initializer_list<std::pair<const_phmap::priv::NonStandardLayout,_int>_> xs;
  pair<const_phmap::priv::NonStandardLayout,_int> *local_758;
  AssertHelper local_710;
  Message local_708;
  int local_6fc;
  size_t local_6f8;
  undefined1 local_6f0 [8];
  AssertionResult gtest_ar_4;
  Message local_6d8;
  vector<std::pair<phmap::priv::NonStandardLayout,_int>,_std::allocator<std::pair<phmap::priv::NonStandardLayout,_int>_>_>
  local_6d0;
  iterator local_6b8;
  iterator ppStack_6b0;
  UnorderedElementsAreArrayMatcher<std::pair<const_phmap::priv::NonStandardLayout,_int>_> local_6a0;
  PredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreArrayMatcher<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
  local_680;
  undefined1 local_660 [8];
  AssertionResult gtest_ar_3;
  Message local_648;
  undefined1 local_640 [8];
  undefined1 local_638 [8];
  AssertionResult gtest_ar_2;
  Message local_620;
  undefined1 local_618 [8];
  undefined1 local_610 [8];
  AssertionResult gtest_ar_1;
  Message local_5f8;
  undefined1 local_5f0 [8];
  undefined1 local_5e8 [8];
  AssertionResult gtest_ar;
  undefined1 local_5c8 [8];
  TypeParam m;
  A alloc;
  E equal;
  H hasher;
  pair<const_phmap::priv::NonStandardLayout,_int> local_118;
  pair<const_phmap::priv::NonStandardLayout,_int> local_e8;
  pair<const_phmap::priv::NonStandardLayout,_int> local_b8;
  pair<const_phmap::priv::NonStandardLayout,_int> local_88;
  pair<const_phmap::priv::NonStandardLayout,_int> local_58;
  undefined1 auStack_28 [8];
  initializer_list<std::pair<const_phmap::priv::NonStandardLayout,_int>_> values;
  Generator<std::pair<const_phmap::priv::NonStandardLayout,_int>,_void> gen;
  InitializerListBucketHashEqualAlloc<phmap::parallel_flat_hash_map<phmap::priv::NonStandardLayout,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>,_4UL,_phmap::NullMutex>_>
  *this_local;
  UnorderedElementsAreArrayMatcher<std::pair<const_phmap::priv::NonStandardLayout,_int>_> *matcher;
  
  hash_internal::Generator<std::pair<const_phmap::priv::NonStandardLayout,_int>,_void>::operator()
            (&local_118,
             (Generator<std::pair<const_phmap::priv::NonStandardLayout,_int>,_void> *)
             ((long)&values._M_len + 7));
  hash_internal::Generator<std::pair<const_phmap::priv::NonStandardLayout,_int>,_void>::operator()
            (&local_e8,
             (Generator<std::pair<const_phmap::priv::NonStandardLayout,_int>,_void> *)
             ((long)&values._M_len + 7));
  hash_internal::Generator<std::pair<const_phmap::priv::NonStandardLayout,_int>,_void>::operator()
            (&local_b8,
             (Generator<std::pair<const_phmap::priv::NonStandardLayout,_int>,_void> *)
             ((long)&values._M_len + 7));
  hash_internal::Generator<std::pair<const_phmap::priv::NonStandardLayout,_int>,_void>::operator()
            (&local_88,
             (Generator<std::pair<const_phmap::priv::NonStandardLayout,_int>,_void> *)
             ((long)&values._M_len + 7));
  hash_internal::Generator<std::pair<const_phmap::priv::NonStandardLayout,_int>,_void>::operator()
            (&local_58,
             (Generator<std::pair<const_phmap::priv::NonStandardLayout,_int>,_void> *)
             ((long)&values._M_len + 7));
  auStack_28 = (undefined1  [8])&local_118;
  values._M_array = (iterator)0x5;
  StatefulTestingHash::StatefulTestingHash((StatefulTestingHash *)&equal);
  StatefulTestingEqual::StatefulTestingEqual((StatefulTestingEqual *)&alloc);
  Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>::Alloc
            ((Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_> *)
             ((long)&m.
                     super_parallel_hash_map<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<phmap::priv::NonStandardLayout,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
                     .
                     super_parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<phmap::priv::NonStandardLayout,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
                     .sets_._M_elems[0xf].set_.settings_ + 0x18),0);
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )auStack_28;
  iVar1._M_len = (size_type)values._M_array;
  iVar1._M_array = (iterator)auStack_28;
  parallel_flat_hash_map<phmap::priv::NonStandardLayout,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>,_4UL,_phmap::NullMutex>
  ::parallel_hash_set((parallel_flat_hash_map<phmap::priv::NonStandardLayout,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>,_4UL,_phmap::NullMutex>
                       *)local_5c8,iVar1,0x7b,(hasher *)&equal,(key_equal *)&alloc,
                      (allocator_type *)
                      ((long)&m.
                              super_parallel_hash_map<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<phmap::priv::NonStandardLayout,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
                              .
                              super_parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<phmap::priv::NonStandardLayout,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
                              .sets_._M_elems[0xf].set_.settings_ + 0x18));
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<phmap::priv::NonStandardLayout,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
  ::hash_function((parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<phmap::priv::NonStandardLayout,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
                   *)local_5f0);
  testing::internal::EqHelper::
  Compare<phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingHash,_nullptr>
            ((EqHelper *)local_5e8,"m.hash_function()","hasher",(StatefulTestingHash *)local_5f0,
             (StatefulTestingHash *)&equal);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5e8);
  if (!bVar2) {
    testing::Message::Message(&local_5f8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_5e8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_map_constructor_test.h"
               ,0x158,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_5f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_5f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_5e8);
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<phmap::priv::NonStandardLayout,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
  ::key_eq((parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<phmap::priv::NonStandardLayout,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
            *)local_618);
  testing::internal::EqHelper::
  Compare<phmap::priv::StatefulTestingEqual,_phmap::priv::StatefulTestingEqual,_nullptr>
            ((EqHelper *)local_610,"m.key_eq()","equal",(StatefulTestingEqual *)local_618,
             (StatefulTestingEqual *)&alloc);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_610);
  if (!bVar2) {
    testing::Message::Message(&local_620);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_610);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_map_constructor_test.h"
               ,0x159,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_620);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_620);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_610);
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<phmap::priv::NonStandardLayout,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
  ::get_allocator((parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<phmap::priv::NonStandardLayout,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
                   *)local_640);
  lhs = (Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_> *)local_640;
  testing::internal::EqHelper::
  Compare<phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>,_nullptr>
            ((EqHelper *)local_638,"m.get_allocator()","alloc",lhs,
             (Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_> *)
             ((long)&m.
                     super_parallel_hash_map<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<phmap::priv::NonStandardLayout,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
                     .
                     super_parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<phmap::priv::NonStandardLayout,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
                     .sets_._M_elems[0xf].set_.settings_ + 0x18));
  Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>::~Alloc
            ((Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_> *)local_640);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_638);
  if (!bVar2) {
    testing::Message::Message(&local_648);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_638);
    lhs = (Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_> *)0x15a;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_map_constructor_test.h"
               ,0x15a,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_648);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_648);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_638);
  local_6b8 = (iterator)auStack_28;
  ppStack_6b0 = values._M_array;
  xs._M_len = (size_type)lhs;
  xs._M_array = values._M_array;
  testing::UnorderedElementsAreArray<std::pair<phmap::priv::NonStandardLayout_const,int>>
            (&local_6a0,(testing *)auStack_28,xs);
  testing::internal::
  MakePredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreArrayMatcher<std::pair<phmap::priv::NonStandardLayout_const,int>>>
            (&local_680,(internal *)&local_6a0,matcher);
  items<phmap::parallel_flat_hash_map<phmap::priv::NonStandardLayout,int,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<phmap::priv::NonStandardLayout_const,int>>,4ul,phmap::NullMutex>>
            (&local_6d0,(priv *)local_5c8,m_00);
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreArrayMatcher<std::pair<phmap::priv::NonStandardLayout_const,int>>>
  ::operator()(local_660,(char *)&local_680,
               (vector<std::pair<phmap::priv::NonStandardLayout,_int>,_std::allocator<std::pair<phmap::priv::NonStandardLayout,_int>_>_>
                *)"items(m)");
  std::
  vector<std::pair<phmap::priv::NonStandardLayout,_int>,_std::allocator<std::pair<phmap::priv::NonStandardLayout,_int>_>_>
  ::~vector(&local_6d0);
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreArrayMatcher<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
  ::~PredicateFormatterFromMatcher(&local_680);
  testing::internal::
  UnorderedElementsAreArrayMatcher<std::pair<const_phmap::priv::NonStandardLayout,_int>_>::
  ~UnorderedElementsAreArrayMatcher(&local_6a0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_660);
  if (!bVar2) {
    testing::Message::Message(&local_6d8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_660);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_map_constructor_test.h"
               ,0x15b,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_6d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_6d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_660);
  local_6f8 = parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<phmap::priv::NonStandardLayout,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
              ::bucket_count((parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<phmap::priv::NonStandardLayout,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
                              *)local_5c8);
  local_6fc = 0x7b;
  testing::internal::CmpHelperGE<unsigned_long,int>
            ((internal *)local_6f0,"m.bucket_count()","123",&local_6f8,&local_6fc);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_6f0);
  if (!bVar2) {
    testing::Message::Message(&local_708);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_6f0);
    testing::internal::AssertHelper::AssertHelper
              (&local_710,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_map_constructor_test.h"
               ,0x15c,pcVar3);
    testing::internal::AssertHelper::operator=(&local_710,&local_708);
    testing::internal::AssertHelper::~AssertHelper(&local_710);
    testing::Message::~Message(&local_708);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_6f0);
  parallel_flat_hash_map<phmap::priv::NonStandardLayout,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>,_4UL,_phmap::NullMutex>
  ::~parallel_flat_hash_map
            ((parallel_flat_hash_map<phmap::priv::NonStandardLayout,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>,_4UL,_phmap::NullMutex>
              *)local_5c8);
  Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>::~Alloc
            ((Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_> *)
             ((long)&m.
                     super_parallel_hash_map<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<phmap::priv::NonStandardLayout,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
                     .
                     super_parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<phmap::priv::NonStandardLayout,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
                     .sets_._M_elems[0xf].set_.settings_ + 0x18));
  local_758 = (pair<const_phmap::priv::NonStandardLayout,_int> *)auStack_28;
  do {
    local_758 = local_758 + -1;
    std::pair<const_phmap::priv::NonStandardLayout,_int>::~pair(local_758);
  } while (local_758 != &local_118);
  return;
}

Assistant:

TYPED_TEST_P(ConstructorTest, InitializerListBucketHashEqualAlloc) {
  using T = hash_internal::GeneratedType<TypeParam>;
  hash_internal::Generator<T> gen;
  std::initializer_list<T> values = {gen(), gen(), gen(), gen(), gen()};
  using H = typename TypeParam::hasher;
  using E = typename TypeParam::key_equal;
  using A = typename TypeParam::allocator_type;
  H hasher;
  E equal;
  A alloc(0);
  TypeParam m(values, 123, hasher, equal, alloc);
  EXPECT_EQ(m.hash_function(), hasher);
  EXPECT_EQ(m.key_eq(), equal);
  EXPECT_EQ(m.get_allocator(), alloc);
  EXPECT_THAT(items(m), ::testing::UnorderedElementsAreArray(values));
  EXPECT_GE(m.bucket_count(), 123);
}